

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

void __thiscall ON_Layer::UnsetPerViewportPersistentVisibility(ON_Layer *this,ON_UUID viewport_id)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  ON__LayerExtensions *pOVar26;
  ON__LayerPerViewSettings *pOVar27;
  long lVar28;
  undefined1 in_R9B;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar40;
  int iVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar41;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ON_UUID viewport_id_00;
  uchar *local_28;
  uchar local_20 [8];
  long lVar44;
  
  local_20 = viewport_id.Data4;
  local_28 = viewport_id._0_8_;
  bVar25 = ON_UuidIsNil((ON_UUID *)&local_28);
  if (bVar25) {
    pOVar26 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    auVar24 = _DAT_0069b120;
    if (pOVar26 != (ON__LayerExtensions *)0x0) {
      iVar1 = (pOVar26->m_vp_settings).m_count;
      if (0 < (long)iVar1) {
        pOVar27 = (pOVar26->m_vp_settings).m_a;
        lVar28 = (long)iVar1 + -1;
        auVar30._8_4_ = (int)lVar28;
        auVar30._0_8_ = lVar28;
        auVar30._12_4_ = (int)((ulong)lVar28 >> 0x20);
        lVar28 = 0;
        auVar31 = auVar30;
        auVar43 = _DAT_006be680;
        auVar45 = _DAT_006be690;
        auVar46 = _DAT_006be6a0;
        auVar47 = _DAT_006be6b0;
        auVar48 = _DAT_006be6c0;
        auVar49 = _DAT_006be6d0;
        auVar50 = _DAT_0069b160;
        auVar51 = _DAT_0069b170;
        do {
          auVar61 = auVar30 ^ auVar24;
          auVar65 = auVar51 ^ auVar24;
          iVar40 = auVar61._0_4_;
          iVar78 = -(uint)(iVar40 < auVar65._0_4_);
          iVar42 = auVar61._4_4_;
          auVar67._4_4_ = -(uint)(iVar42 < auVar65._4_4_);
          iVar63 = auVar61._8_4_;
          iVar82 = -(uint)(iVar63 < auVar65._8_4_);
          iVar64 = auVar61._12_4_;
          auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
          auVar61._4_4_ = iVar78;
          auVar61._0_4_ = iVar78;
          auVar61._8_4_ = iVar82;
          auVar61._12_4_ = iVar82;
          auVar61 = pshuflw(auVar31,auVar61,0xe8);
          auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar42);
          auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar52 = pshuflw(in_XMM11,auVar66,0xe8);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar65 = pshuflw(auVar61,auVar67,0xe8);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar31 = (auVar65 | auVar52 & auVar61) ^ auVar31;
          auVar31 = packssdw(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27->m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar52._4_4_ = iVar78;
          auVar52._0_4_ = iVar78;
          auVar52._8_4_ = iVar82;
          auVar52._12_4_ = iVar82;
          auVar67 = auVar66 & auVar52 | auVar67;
          auVar31 = packssdw(auVar67,auVar67);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar65,auVar31 ^ auVar65);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[1].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar50 ^ auVar24;
          auVar53._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar53._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar53._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar53._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar68._4_4_ = auVar53._0_4_;
          auVar68._0_4_ = auVar53._0_4_;
          auVar68._8_4_ = auVar53._8_4_;
          auVar68._12_4_ = auVar53._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar11._4_4_ = iVar78;
          auVar11._0_4_ = iVar78;
          auVar11._8_4_ = iVar82;
          auVar11._12_4_ = iVar82;
          auVar79._4_4_ = auVar53._4_4_;
          auVar79._0_4_ = auVar53._4_4_;
          auVar79._8_4_ = auVar53._12_4_;
          auVar79._12_4_ = auVar53._12_4_;
          auVar31 = auVar11 & auVar68 | auVar79;
          auVar31 = packssdw(auVar31,auVar31);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar2,auVar31 ^ auVar2);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[2].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = pshufhw(auVar31,auVar68,0x84);
          auVar12._4_4_ = iVar78;
          auVar12._0_4_ = iVar78;
          auVar12._8_4_ = iVar82;
          auVar12._12_4_ = iVar82;
          auVar65 = pshufhw(auVar53,auVar12,0x84);
          auVar61 = pshufhw(auVar31,auVar79,0x84);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar32 = (auVar61 | auVar65 & auVar31) ^ auVar32;
          auVar31 = packssdw(auVar32,auVar32);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[3].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar49 ^ auVar24;
          auVar54._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar54._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar54._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar54._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar13._4_4_ = auVar54._0_4_;
          auVar13._0_4_ = auVar54._0_4_;
          auVar13._8_4_ = auVar54._8_4_;
          auVar13._12_4_ = auVar54._8_4_;
          auVar65 = pshuflw(auVar79,auVar13,0xe8);
          auVar33._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar33._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar69._4_4_ = auVar33._4_4_;
          auVar69._0_4_ = auVar33._4_4_;
          auVar69._8_4_ = auVar33._12_4_;
          auVar69._12_4_ = auVar33._12_4_;
          auVar31 = pshuflw(auVar33,auVar69,0xe8);
          auVar70._4_4_ = auVar54._4_4_;
          auVar70._0_4_ = auVar54._4_4_;
          auVar70._8_4_ = auVar54._12_4_;
          auVar70._12_4_ = auVar54._12_4_;
          auVar61 = pshuflw(auVar54,auVar70,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar3);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[4].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar14._4_4_ = auVar54._0_4_;
          auVar14._0_4_ = auVar54._0_4_;
          auVar14._8_4_ = auVar54._8_4_;
          auVar14._12_4_ = auVar54._8_4_;
          auVar70 = auVar69 & auVar14 | auVar70;
          auVar61 = packssdw(auVar70,auVar70);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31,auVar61 ^ auVar4);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._4_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[5].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar48 ^ auVar24;
          auVar55._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar55._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar55._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar55._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar71._4_4_ = auVar55._0_4_;
          auVar71._0_4_ = auVar55._0_4_;
          auVar71._8_4_ = auVar55._8_4_;
          auVar71._12_4_ = auVar55._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar15._4_4_ = iVar78;
          auVar15._0_4_ = iVar78;
          auVar15._8_4_ = iVar82;
          auVar15._12_4_ = iVar82;
          auVar80._4_4_ = auVar55._4_4_;
          auVar80._0_4_ = auVar55._4_4_;
          auVar80._8_4_ = auVar55._12_4_;
          auVar80._12_4_ = auVar55._12_4_;
          auVar31 = auVar15 & auVar71 | auVar80;
          auVar31 = packssdw(auVar31,auVar31);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar5,auVar31 ^ auVar5);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[6].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = pshufhw(auVar31,auVar71,0x84);
          auVar16._4_4_ = iVar78;
          auVar16._0_4_ = iVar78;
          auVar16._8_4_ = iVar82;
          auVar16._12_4_ = iVar82;
          auVar65 = pshufhw(auVar55,auVar16,0x84);
          auVar61 = pshufhw(auVar31,auVar80,0x84);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar34 = (auVar61 | auVar65 & auVar31) ^ auVar34;
          auVar31 = packssdw(auVar34,auVar34);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._6_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[7].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar47 ^ auVar24;
          auVar56._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar56._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar56._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar56._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar17._4_4_ = auVar56._0_4_;
          auVar17._0_4_ = auVar56._0_4_;
          auVar17._8_4_ = auVar56._8_4_;
          auVar17._12_4_ = auVar56._8_4_;
          auVar65 = pshuflw(auVar80,auVar17,0xe8);
          auVar35._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar35._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar35._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar35._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar72._4_4_ = auVar35._4_4_;
          auVar72._0_4_ = auVar35._4_4_;
          auVar72._8_4_ = auVar35._12_4_;
          auVar72._12_4_ = auVar35._12_4_;
          auVar31 = pshuflw(auVar35,auVar72,0xe8);
          auVar73._4_4_ = auVar56._4_4_;
          auVar73._0_4_ = auVar56._4_4_;
          auVar73._8_4_ = auVar56._12_4_;
          auVar73._12_4_ = auVar56._12_4_;
          auVar61 = pshuflw(auVar56,auVar73,0xe8);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar61 | auVar31 & auVar65) ^ auVar57;
          auVar61 = packssdw(auVar57,auVar57);
          auVar31 = packsswb(auVar31 & auVar65,auVar61);
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[8].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar18._4_4_ = auVar56._0_4_;
          auVar18._0_4_ = auVar56._0_4_;
          auVar18._8_4_ = auVar56._8_4_;
          auVar18._12_4_ = auVar56._8_4_;
          auVar73 = auVar72 & auVar18 | auVar73;
          auVar61 = packssdw(auVar73,auVar73);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar61 = packssdw(auVar61 ^ auVar6,auVar61 ^ auVar6);
          auVar31 = packsswb(auVar31,auVar61);
          if ((auVar31._8_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[9].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar46 ^ auVar24;
          auVar58._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar58._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar58._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar58._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar74._4_4_ = auVar58._0_4_;
          auVar74._0_4_ = auVar58._0_4_;
          auVar74._8_4_ = auVar58._8_4_;
          auVar74._12_4_ = auVar58._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar19._4_4_ = iVar78;
          auVar19._0_4_ = iVar78;
          auVar19._8_4_ = iVar82;
          auVar19._12_4_ = iVar82;
          auVar81._4_4_ = auVar58._4_4_;
          auVar81._0_4_ = auVar58._4_4_;
          auVar81._8_4_ = auVar58._12_4_;
          auVar81._12_4_ = auVar58._12_4_;
          auVar31 = auVar19 & auVar74 | auVar81;
          auVar31 = packssdw(auVar31,auVar31);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar7,auVar31 ^ auVar7);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[10].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = pshufhw(auVar31,auVar74,0x84);
          auVar20._4_4_ = iVar78;
          auVar20._0_4_ = iVar78;
          auVar20._8_4_ = iVar82;
          auVar20._12_4_ = iVar82;
          auVar65 = pshufhw(auVar58,auVar20,0x84);
          auVar61 = pshufhw(auVar31,auVar81,0x84);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar36 = (auVar61 | auVar65 & auVar31) ^ auVar36;
          auVar31 = packssdw(auVar36,auVar36);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._10_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[0xb].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar45 ^ auVar24;
          auVar59._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar59._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar59._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar59._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar21._4_4_ = auVar59._0_4_;
          auVar21._0_4_ = auVar59._0_4_;
          auVar21._8_4_ = auVar59._8_4_;
          auVar21._12_4_ = auVar59._8_4_;
          auVar65 = pshuflw(auVar81,auVar21,0xe8);
          auVar37._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar37._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar37._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar37._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar75._4_4_ = auVar37._4_4_;
          auVar75._0_4_ = auVar37._4_4_;
          auVar75._8_4_ = auVar37._12_4_;
          auVar75._12_4_ = auVar37._12_4_;
          auVar31 = pshuflw(auVar37,auVar75,0xe8);
          auVar76._4_4_ = auVar59._4_4_;
          auVar76._0_4_ = auVar59._4_4_;
          auVar76._8_4_ = auVar59._12_4_;
          auVar76._12_4_ = auVar59._12_4_;
          auVar61 = pshuflw(auVar59,auVar76,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar8);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[0xc].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar22._4_4_ = auVar59._0_4_;
          auVar22._0_4_ = auVar59._0_4_;
          auVar22._8_4_ = auVar59._8_4_;
          auVar22._12_4_ = auVar59._8_4_;
          auVar76 = auVar75 & auVar22 | auVar76;
          auVar61 = packssdw(auVar76,auVar76);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31,auVar61 ^ auVar9);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._12_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[0xd].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = auVar43 ^ auVar24;
          auVar60._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar60._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar60._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar60._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar77._4_4_ = auVar60._0_4_;
          auVar77._0_4_ = auVar60._0_4_;
          auVar77._8_4_ = auVar60._8_4_;
          auVar77._12_4_ = auVar60._8_4_;
          iVar40 = -(uint)(auVar31._4_4_ == iVar42);
          iVar42 = -(uint)(auVar31._12_4_ == iVar64);
          auVar62._4_4_ = iVar40;
          auVar62._0_4_ = iVar40;
          auVar62._8_4_ = iVar42;
          auVar62._12_4_ = iVar42;
          auVar38._4_4_ = auVar60._4_4_;
          auVar38._0_4_ = auVar60._4_4_;
          auVar38._8_4_ = auVar60._12_4_;
          auVar38._12_4_ = auVar60._12_4_;
          auVar38 = auVar62 & auVar77 | auVar38;
          auVar31 = packssdw(auVar38,auVar38);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar10,auVar31 ^ auVar10);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uchar *)((long)(&pOVar27[0xe].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          auVar31 = pshufhw(auVar31,auVar77,0x84);
          in_XMM11 = pshufhw(auVar60,auVar62,0x84);
          in_XMM11 = in_XMM11 & auVar31;
          auVar23._4_4_ = auVar60._4_4_;
          auVar23._0_4_ = auVar60._4_4_;
          auVar23._8_4_ = auVar60._12_4_;
          auVar23._12_4_ = auVar60._12_4_;
          auVar31 = pshufhw(auVar31,auVar23,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar31 | in_XMM11) ^ auVar39;
          auVar31 = packssdw(auVar39,auVar39);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._14_2_ >> 8 & 1) != 0) {
            *(uchar *)((long)(&pOVar27[0xf].m_viewport_id + 2) + lVar28 + 1) = '\0';
          }
          lVar29 = (long)DAT_006be6e0;
          lVar44 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + lVar29;
          lVar41 = DAT_006be6e0._8_8_;
          auVar51._8_8_ = lVar44 + lVar41;
          lVar44 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + lVar29;
          auVar50._8_8_ = lVar44 + lVar41;
          lVar44 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + lVar29;
          auVar49._8_8_ = lVar44 + lVar41;
          lVar44 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + lVar29;
          auVar48._8_8_ = lVar44 + lVar41;
          lVar44 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + lVar29;
          auVar47._8_8_ = lVar44 + lVar41;
          lVar44 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + lVar29;
          auVar46._8_8_ = lVar44 + lVar41;
          lVar44 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + lVar29;
          auVar45._8_8_ = lVar44 + lVar41;
          lVar44 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + lVar29;
          auVar43._8_8_ = lVar44 + lVar41;
          lVar28 = lVar28 + 0x280;
          auVar31 = _DAT_006be6e0;
        } while ((ulong)(iVar1 + 0xfU >> 4) * 0x280 != lVar28);
      }
    }
  }
  else {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = local_20;
    pOVar27 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_28,
                         viewport_id_00,(bool)in_R9B);
    if (pOVar27 != (ON__LayerPerViewSettings *)0x0) {
      pOVar27->m_persistent_visibility = '\0';
    }
  }
  return;
}

Assistant:

void ON_Layer::UnsetPerViewportPersistentVisibility( ON_UUID viewport_id )
{
  // added to fix bug 82587
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions( *this, &m_extension_bits, false );
    if ( 0 != ud )
    {
      for ( int i = 0; i < ud->m_vp_settings.Count(); i++ )
      {
        ud->m_vp_settings[i].m_persistent_visibility = 0;
      }
    }
  }
  else
  {
    bool bCreate = false; // This "false" is correct because the per viewport visibility
                          // setting needs to be in existence for this call to make any
                          // sense in the first place.
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, bCreate );
    if (vp_settings )
      vp_settings->m_persistent_visibility = 0;
  }
}